

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int __thiscall
icu_63::RuleBasedCollator::clone
          (RuleBasedCollator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedCollator *this_00;
  undefined8 local_30;
  RuleBasedCollator *this_local;
  
  this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)__fn);
  local_30 = (RuleBasedCollator *)0x0;
  if (this_00 != (RuleBasedCollator *)0x0) {
    RuleBasedCollator(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Collator *
RuleBasedCollator::clone() const {
    return new RuleBasedCollator(*this);
}